

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_finit.c
# Opt level: O0

int unknownEvent(void *arg,mpt_event *ev)

{
  mpt_message *pmVar1;
  size_t sVar2;
  byte local_49;
  undefined1 auStack_48 [7];
  uint8_t type;
  mpt_message msg;
  mpt_logger *log;
  mpt_event *ev_local;
  void *arg_local;
  
  if (ev == (mpt_event *)0x0) {
    arg_local._4_4_ = 0;
  }
  else {
    msg.clen = (size_t)arg;
    if (ev->id == 0) {
      if (ev->msg == (mpt_message *)0x0) {
        if (ev->reply == (mpt_reply_context *)0x0) {
          mpt_log((mpt_logger *)arg,"mpt::event::unknown",3,"%s","message required");
        }
        else {
          mpt_context_reply(ev->reply,-0x10,"%s","message required");
        }
        arg_local._4_4_ = 3;
      }
      else {
        pmVar1 = ev->msg;
        _auStack_48 = pmVar1->used;
        msg.used = (size_t)pmVar1->base;
        msg.base = pmVar1->cont;
        msg.cont = (iovec *)pmVar1->clen;
        sVar2 = mpt_message_read((mpt_message *)auStack_48,1,&local_49);
        if (sVar2 == 0) {
          mpt_log((mpt_logger *)msg.clen,"unknownEvent",4,"%s","empty message");
          arg_local._4_4_ = 0;
        }
        else {
          if (ev->reply == (mpt_reply_context *)0x0) {
            mpt_log((mpt_logger *)msg.clen,"mpt::event::unknown",3,"%s: %02x",
                    "unable to process message type",(ulong)local_49);
          }
          else {
            mpt_context_reply(ev->reply,-4,"%s: %02x","unable to process message type",
                              (ulong)local_49);
          }
          arg_local._4_4_ = 2;
        }
      }
    }
    else {
      if (ev->reply == (mpt_reply_context *)0x0) {
        mpt_log((mpt_logger *)arg,"mpt::event::unknown",3,"%s: %lx","invalid command",ev->id);
      }
      else {
        mpt_context_reply(ev->reply,-1,"%s: %lx","invalid command",ev->id);
      }
      ev->id = 0;
      arg_local._4_4_ = 3;
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int unknownEvent(void *arg, MPT_STRUCT(event) *ev)
{
	static const char _func[] = "mpt::event::unknown";
	MPT_INTERFACE(logger) *log = arg;
	
	if (!ev) {
		return 0;
	}
	/* bad event id */
	if (ev->id) {
		if (ev->reply) {
			mpt_context_reply(ev->reply, MPT_ERROR(BadArgument), "%s: %" PRIxPTR,
			                  MPT_tr("invalid command"), ev->id);
		} else {
			mpt_log(log, _func, MPT_LOG(Error), "%s: %" PRIxPTR,
			        MPT_tr("invalid command"), ev->id);
		}
		ev->id = 0;
		return MPT_EVENTFLAG(Default) | MPT_EVENTFLAG(Fail);
	}
	/* bad default event */
	if (!ev->msg) {
		if (ev->reply) {
			mpt_context_reply(ev->reply, MPT_ERROR(MissingData), "%s",
			                  MPT_tr("message required"));
		} else {
			mpt_log(log, _func, MPT_LOG(Error), "%s",
			        MPT_tr("message required"));
		}
		return MPT_EVENTFLAG(Default) | MPT_EVENTFLAG(Fail);
	}
	/* bad message type */
	else {
		MPT_STRUCT(message) msg = *ev->msg;
		uint8_t type;
		
		if (!mpt_message_read(&msg, 1, &type)) {
			mpt_log(log, __func__, MPT_LOG(Warning), "%s", MPT_tr("empty message"));
			return MPT_EVENTFLAG(None);
		}
		if (ev->reply) {
			mpt_context_reply(ev->reply, MPT_ERROR(BadOperation), "%s: %02x",
			                  MPT_tr("unable to process message type"), type);
		} else {
			mpt_log(log, _func, MPT_LOG(Error), "%s: %02x",
			        MPT_tr("unable to process message type"), type);
		}
		return MPT_EVENTFLAG(Fail);
	}
}